

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddMouseWheelEvent(ImGuiIO *this,float wheel_x,float wheel_y)

{
  ImGuiInputEvent local_18;
  
  if (&GImGui->IO == this) {
    if (((((wheel_x != 0.0) || (NAN(wheel_x))) || (wheel_y != 0.0)) || (NAN(wheel_y))) &&
       (this->AppAcceptingEvents == true)) {
      local_18._16_8_ = 0;
      local_18.Type = ImGuiInputEventType_MouseWheel;
      local_18.Source = ImGuiInputSource_Mouse;
      local_18.field_2.MousePos.PosX = wheel_x;
      local_18.field_2.MousePos.PosY = wheel_y;
      ImVector<ImGuiInputEvent>::push_back(&GImGui->InputEventsQueue,&local_18);
    }
    return;
  }
  __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                ,0x56d,"void ImGuiIO::AddMouseWheelEvent(float, float)");
}

Assistant:

void ImGuiIO::AddMouseWheelEvent(float wheel_x, float wheel_y)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if ((wheel_x == 0.0f && wheel_y == 0.0f) || !AppAcceptingEvents)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseWheel;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseWheel.WheelX = wheel_x;
    e.MouseWheel.WheelY = wheel_y;
    g.InputEventsQueue.push_back(e);
}